

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_26ba73::PulseCapture::stop(PulseCapture *this)

{
  pa_operation *op;
  unique_lock<std::mutex> plock;
  
  std::unique_lock<std::mutex>::unique_lock(&plock,&(this->mMainloop).mMutex);
  op = (pa_operation *)
       (*(anonymous_namespace)::ppa_stream_cork)
                 (this->mStream,1,PulseMainloop::streamSuccessCallbackC,&this->mMainloop);
  PulseMainloop::waitForOperation(&this->mMainloop,op,&plock);
  std::unique_lock<std::mutex>::~unique_lock(&plock);
  return;
}

Assistant:

void PulseCapture::stop()
{
    auto plock = mMainloop.getUniqueLock();
    pa_operation *op{pa_stream_cork(mStream, 1, &PulseMainloop::streamSuccessCallbackC,
        &mMainloop)};
    mMainloop.waitForOperation(op, plock);
}